

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::ConHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *this,int info)

{
  int iVar1;
  uint in_ESI;
  ConHandler *in_RDI;
  StringRef SVar2;
  IntSuffixHandler suffix_handler_1;
  DblSuffixHandler suffix_handler;
  Kind kind;
  StringRef name;
  int num_values;
  int num_items;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *in_stack_ffffffffffffff88;
  TextReader<fmt::Locale> *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  TextReader<fmt::Locale> *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int num_items_00;
  int in_stack_ffffffffffffffbc;
  int num_values_00;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *in_stack_ffffffffffffffc0;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *local_28;
  ConHandler local_18;
  int local_10;
  uint local_c;
  
  local_c = in_ESI;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::ConHandler::ConHandler
            (in_RDI,in_stack_ffffffffffffff88);
  local_10 = NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::ConHandler::num_items
                       (&local_18);
  iVar1 = NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::ReadUInt
                    ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)
                     in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  SVar2 = TextReader<fmt::Locale>::ReadName(in_stack_ffffffffffffffa0);
  TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_ffffffffffffffb0);
  local_28 = (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *)SVar2.size_;
  if ((local_c & 4) == 0) {
    TestNLHandler2::OnIntSuffix
              ((TestNLHandler2 *)
               in_RDI[2].
               super_ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::ItemType)2>
               .reader_,SVar2,local_c & 3,iVar1);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::IntReader,TestNLHandler2::SuffixHandler<int>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
               (SuffixHandler<int> *)in_stack_ffffffffffffffb0);
  }
  else {
    num_items_00 = (int)SVar2.data_;
    num_values_00 = SVar2.data_._4_4_;
    TestNLHandler2::OnDblSuffix
              ((TestNLHandler2 *)
               in_RDI[2].
               super_ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::ItemType)2>
               .reader_,SVar2,local_c & 3,iVar1);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::DoubleReader,TestNLHandler2::SuffixHandler<double>>
              (local_28,num_values_00,num_items_00,
               (SuffixHandler<double> *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}